

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O0

istream * spvtools::utils::operator>>
                    (istream *is,
                    HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
                    *value)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  ushort uVar4;
  short sVar5;
  fmtflags __a;
  _Ios_Fmtflags _Var6;
  int iVar7;
  bool bVar8;
  byte local_7a;
  bool local_79;
  byte local_72;
  byte local_71;
  FloatProxy<spvtools::utils::Float16> local_66;
  ushort local_64;
  ushort local_62;
  undefined2 local_60;
  FloatProxy<spvtools::utils::Float16> output_float;
  uint_type shifted_exponent;
  uint_type output_bits;
  int_type max_exponent;
  bool is_zero;
  int_type digit;
  int_type written_exponent_overflow;
  int_type written_exponent;
  bool seen_written_exponent_digits;
  int8_t exponent_sign;
  bool seen_exponent_sign;
  uint_type write_bit_1;
  int i_1;
  int number_1;
  uint_type write_bit;
  int i;
  int number;
  unsigned_short local_34;
  bool bits_written;
  bool has_integer_part;
  int_type exponent;
  uint_type fraction_index;
  uint_type fraction;
  bool seen_dot;
  bool seen_p;
  int_type maybe_hex_start;
  FloatProxy<spvtools::utils::Float16> FStack_22;
  bool negate_value;
  int_type next_char;
  HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
  *value_local;
  istream *is_local;
  
  _next_char = value;
  value_local = (HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
                 *)is;
  FloatProxy<spvtools::utils::Float16>::FloatProxy(&stack0xffffffffffffffde,0);
  HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
  ::set_value(value,FStack_22);
  __a = std::ios_base::flags
                  ((ios_base *)
                   ((long)&(value_local->value_).data_ + *(long *)(*(long *)value_local + -0x18)));
  _Var6 = std::operator&(__a,_S_skipws);
  if (_Var6 != ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max)) {
    while( true ) {
      iVar7 = std::istream::peek();
      iVar7 = isspace(iVar7);
      if (iVar7 == 0) break;
      std::istream::get();
    }
  }
  maybe_hex_start = std::istream::peek();
  seen_p = false;
  if ((maybe_hex_start == 0x2d) || (maybe_hex_start == 0x30)) {
    if (maybe_hex_start == 0x2d) {
      seen_p = true;
      std::istream::get();
      maybe_hex_start = std::istream::peek();
    }
    if (maybe_hex_start == 0x30) {
      std::istream::get();
      _exponent = std::istream::peek();
      if ((_exponent == 0x78) || (_exponent == 0x58)) {
        std::istream::get();
        has_integer_part = false;
        bits_written = false;
        local_34 = 0;
        number._2_2_ = 0;
        number._0_2_ = 0xf;
        while (maybe_hex_start = std::istream::peek(), maybe_hex_start == 0x30) {
          std::istream::get();
        }
        bVar1 = false;
        bVar8 = false;
        while( true ) {
          local_71 = 0;
          if ((has_integer_part & 1U) == 0) {
            local_71 = bits_written ^ 0xff;
          }
          if ((local_71 & 1) == 0) break;
          if (maybe_hex_start == 0x2e) {
            bits_written = true;
          }
          else if (maybe_hex_start == 0x70) {
            has_integer_part = true;
          }
          else {
            iVar7 = isxdigit(maybe_hex_start);
            if (iVar7 == 0) {
              std::ios::setstate((int)value_local +
                                 (int)*(undefined8 *)(*(long *)value_local + -0x18));
              return (istream *)value_local;
            }
            bVar1 = true;
            bVar2 = get_nibble_from_character(maybe_hex_start);
            for (number_1 = 0; number_1 < 4; number_1 = number_1 + 1) {
              uVar4 = (ushort)((bVar2 & 8) != 0);
              if (bVar8) {
                local_34 = detail::set_nth_most_significant_bit<unsigned_short>
                                     (local_34,uVar4,number._2_2_);
                detail::saturated_inc<unsigned_short>((unsigned_short *)((long)&number + 2));
                bVar3 = detail::saturated_inc<short>((short *)&number);
                if (!bVar3) {
                  std::ios::setstate((int)value_local +
                                     (int)*(undefined8 *)(*(long *)value_local + -0x18));
                  return (istream *)value_local;
                }
              }
              bVar8 = bVar8 || uVar4 != 0;
              bVar2 = bVar2 << 1;
            }
          }
          std::istream::get();
          maybe_hex_start = std::istream::peek();
        }
        bVar8 = false;
        while( true ) {
          local_72 = 0;
          if ((bits_written & 1U) != 0) {
            local_72 = has_integer_part ^ 0xff;
          }
          if ((local_72 & 1) == 0) break;
          if (maybe_hex_start == 0x70) {
            has_integer_part = true;
          }
          else {
            iVar7 = isxdigit(maybe_hex_start);
            if (iVar7 == 0) {
              std::ios::setstate((int)value_local +
                                 (int)*(undefined8 *)(*(long *)value_local + -0x18));
              return (istream *)value_local;
            }
            bVar2 = get_nibble_from_character(maybe_hex_start);
            for (_written_exponent = 0; _written_exponent < 4;
                _written_exponent = _written_exponent + 1) {
              uVar4 = (ushort)((bVar2 & 8) != 0);
              bVar8 = bVar8 || uVar4 != 0;
              if ((bVar1) || (bVar8)) {
                local_34 = detail::set_nth_most_significant_bit<unsigned_short>
                                     (local_34,uVar4,number._2_2_);
                detail::saturated_inc<unsigned_short>((unsigned_short *)((long)&number + 2));
              }
              else {
                bVar3 = detail::saturated_dec<short>((short *)&number);
                if (!bVar3) {
                  std::ios::setstate((int)value_local +
                                     (int)*(undefined8 *)(*(long *)value_local + -0x18));
                  return (istream *)value_local;
                }
              }
              bVar2 = bVar2 << 1;
            }
          }
          std::istream::get();
          maybe_hex_start = std::istream::peek();
        }
        bVar3 = false;
        digit._0_1_ = '\x01';
        bVar8 = false;
        max_exponent = 0;
        do {
          if ((bVar8) || ((maybe_hex_start != 0x2d && (maybe_hex_start != 0x2b)))) {
            iVar7 = isdigit(maybe_hex_start);
            if (iVar7 == 0) {
              if (!bVar8) {
                std::ios::setstate((int)value_local +
                                   (int)*(undefined8 *)(*(long *)value_local + -0x18));
                return (istream *)value_local;
              }
              sVar5 = max_exponent * (char)digit;
              if ((sVar5 < 0) || ((short)(ushort)number < 0)) {
                if ((sVar5 < 0) && ((short)(ushort)number < 0)) {
                  if (-(int)sVar5 < (short)(ushort)number + 0x7ffe) {
                    number._0_2_ = sVar5 + (ushort)number;
                  }
                  else {
                    number._0_2_ = 0x8002;
                  }
                }
                else {
                  number._0_2_ = sVar5 + (ushort)number;
                }
              }
              else if ((int)sVar5 < 0x7ffe - (short)(ushort)number) {
                number._0_2_ = sVar5 + (ushort)number;
              }
              else {
                number._0_2_ = 0x7ffe;
              }
              bVar8 = !bVar1;
              bVar3 = local_34 == 0;
              local_79 = bVar8 && bVar3;
              output_float.data_._1_1_ = local_79;
              if ((bVar1) || (local_79)) {
                if (bVar8 && bVar3) {
                  number._0_2_ = 0;
                }
              }
              else {
                local_34 = local_34 << 1;
                number._0_2_ = (ushort)number - 1;
              }
              if (((short)(ushort)number < 1) && (!bVar8 || !bVar3)) {
                local_34 = (ushort)((int)(uint)local_34 >> 1) | 0x8000;
              }
              local_34 = (unsigned_short)((int)(uint)local_34 >> 6);
              local_60 = 0x1f;
              while( true ) {
                local_7a = 0;
                if ((short)(ushort)number < 0) {
                  local_7a = output_float.data_._1_1_ ^ 0xff;
                }
                if ((local_7a & 1) == 0) break;
                local_34 = (unsigned_short)((int)(uint)local_34 >> 1);
                number._0_2_ = (ushort)number + 1;
                if (local_34 == 0) {
                  output_float.data_._1_1_ = true;
                  number._0_2_ = 0;
                }
              }
              if (0x1f < (short)(ushort)number) {
                number._0_2_ = 0x1f;
                local_34 = 0;
              }
              local_64 = ((ushort)number & 0x1f) << 10;
              local_62 = (ushort)((seen_p & 1U) != 0) << 0xf | local_34 | local_64;
              FloatProxy<spvtools::utils::Float16>::FloatProxy(&local_66,local_62);
              HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
              ::set_value(_next_char,local_66);
              return (istream *)value_local;
            }
            bVar8 = true;
            sVar5 = (short)maybe_hex_start + -0x30;
            if ((int)max_exponent < (0x7ffe - sVar5) / 10) {
              max_exponent = max_exponent * 10 + sVar5;
            }
            else {
              max_exponent = 0x7ffe;
            }
          }
          else {
            if (bVar3) {
              std::ios::setstate((int)value_local +
                                 (int)*(undefined8 *)(*(long *)value_local + -0x18));
              return (istream *)value_local;
            }
            bVar3 = true;
            digit._0_1_ = '\x01';
            if (maybe_hex_start == 0x2d) {
              digit._0_1_ = -1;
            }
          }
          std::istream::get();
          maybe_hex_start = std::istream::peek();
        } while( true );
      }
      std::istream::unget();
      is_local = ParseNormalFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>>>
                           ((istream *)value_local,(bool)(seen_p & 1),_next_char);
    }
    else {
      is_local = ParseNormalFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>>>
                           ((istream *)value_local,(bool)(seen_p & 1),_next_char);
    }
  }
  else {
    is_local = ParseNormalFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>>>
                         ((istream *)value_local,false,_next_char);
  }
  return is_local;
}

Assistant:

std::istream& operator>>(std::istream& is, HexFloat<T, Traits>& value) {
  using HF = HexFloat<T, Traits>;
  using uint_type = typename HF::uint_type;
  using int_type = typename HF::int_type;

  value.set_value(static_cast<typename HF::native_type>(0.f));

  if (is.flags() & std::ios::skipws) {
    // If the user wants to skip whitespace , then we should obey that.
    while (std::isspace(is.peek())) {
      is.get();
    }
  }

  auto next_char = is.peek();
  bool negate_value = false;

  if (next_char != '-' && next_char != '0') {
    return ParseNormalFloat(is, negate_value, value);
  }

  if (next_char == '-') {
    negate_value = true;
    is.get();
    next_char = is.peek();
  }

  if (next_char == '0') {
    is.get();  // We may have to unget this.
    auto maybe_hex_start = is.peek();
    if (maybe_hex_start != 'x' && maybe_hex_start != 'X') {
      is.unget();
      return ParseNormalFloat(is, negate_value, value);
    } else {
      is.get();  // Throw away the 'x';
    }
  } else {
    return ParseNormalFloat(is, negate_value, value);
  }

  // This "looks" like a hex-float so treat it as one.
  bool seen_p = false;
  bool seen_dot = false;

  // The mantissa bits, without the most significant 1 bit, and with the
  // the most recently read bits in the least significant positions.
  uint_type fraction = 0;
  // The number of mantissa bits that have been read, including the leading 1
  // bit that is not written into 'fraction'.
  uint_type fraction_index = 0;

  // TODO(dneto): handle overflow and underflow
  int_type exponent = HF::exponent_bias;

  // Strip off leading zeros so we don't have to special-case them later.
  while ((next_char = is.peek()) == '0') {
    is.get();
  }

  // Does the mantissa, as written, have non-zero digits to the left of
  // the decimal point.  Assume no until proven otherwise.
  bool has_integer_part = false;
  bool bits_written = false;  // Stays false until we write a bit.

  // Scan the mantissa hex digits until we see a '.' or the 'p' that
  // starts the exponent.
  while (!seen_p && !seen_dot) {
    // Handle characters that are left of the fractional part.
    if (next_char == '.') {
      seen_dot = true;
    } else if (next_char == 'p') {
      seen_p = true;
    } else if (::isxdigit(next_char)) {
      // We have stripped all leading zeroes and we have not yet seen a ".".
      has_integer_part = true;
      int number = get_nibble_from_character(next_char);
      for (int i = 0; i < 4; ++i, number <<= 1) {
        uint_type write_bit = (number & 0x8) ? 0x1 : 0x0;
        if (bits_written) {
          // If we are here the bits represented belong in the fractional
          // part of the float, and we have to adjust the exponent accordingly.
          fraction = detail::set_nth_most_significant_bit(fraction, write_bit,
                                                          fraction_index);
          // Increment the fraction index. If the input has bizarrely many
          // significant digits, then silently drop them.
          detail::saturated_inc(fraction_index);
          if (!detail::saturated_inc(exponent)) {
            // Overflow failure
            is.setstate(std::ios::failbit);
            return is;
          }
        }
        // Since this updated after setting fraction bits, this effectively
        // drops the leading 1 bit.
        bits_written |= write_bit != 0;
      }
    } else {
      // We have not found our exponent yet, so we have to fail.
      is.setstate(std::ios::failbit);
      return is;
    }
    is.get();
    next_char = is.peek();
  }

  // Finished reading the part preceding any '.' or 'p'.

  bits_written = false;
  while (seen_dot && !seen_p) {
    // Handle only fractional parts now.
    if (next_char == 'p') {
      seen_p = true;
    } else if (::isxdigit(next_char)) {
      int number = get_nibble_from_character(next_char);
      for (int i = 0; i < 4; ++i, number <<= 1) {
        uint_type write_bit = (number & 0x8) ? 0x01 : 0x00;
        bits_written |= write_bit != 0;
        if ((!has_integer_part) && !bits_written) {
          // Handle modifying the exponent here this way we can handle
          // an arbitrary number of hex values without overflowing our
          // integer.
          if (!detail::saturated_dec(exponent)) {
            // Overflow failure
            is.setstate(std::ios::failbit);
            return is;
          }
        } else {
          fraction = detail::set_nth_most_significant_bit(fraction, write_bit,
                                                          fraction_index);
          // Increment the fraction index. If the input has bizarrely many
          // significant digits, then silently drop them.
          detail::saturated_inc(fraction_index);
        }
      }
    } else {
      // We still have not found our 'p' exponent yet, so this is not a valid
      // hex-float.
      is.setstate(std::ios::failbit);
      return is;
    }
    is.get();
    next_char = is.peek();
  }

  // Finished reading the part preceding 'p'.
  // In hex floats syntax, the binary exponent is required.

  bool seen_exponent_sign = false;
  int8_t exponent_sign = 1;
  bool seen_written_exponent_digits = false;
  // The magnitude of the exponent, as written, or the sentinel value to signal
  // overflow.
  int_type written_exponent = 0;
  // A sentinel value signalling overflow of the magnitude of the written
  // exponent.  We'll assume that -written_exponent_overflow is valid for the
  // type. Later we may add 1 or subtract 1 from the adjusted exponent, so leave
  // room for an extra 1.
  const int_type written_exponent_overflow =
      std::numeric_limits<int_type>::max() - 1;
  while (true) {
    if (!seen_written_exponent_digits &&
        (next_char == '-' || next_char == '+')) {
      if (seen_exponent_sign) {
        is.setstate(std::ios::failbit);
        return is;
      }
      seen_exponent_sign = true;
      exponent_sign = (next_char == '-') ? -1 : 1;
    } else if (::isdigit(next_char)) {
      seen_written_exponent_digits = true;
      // Hex-floats express their exponent as decimal.
      int_type digit =
          static_cast<int_type>(static_cast<int_type>(next_char) - '0');
      if (written_exponent >= (written_exponent_overflow - digit) / 10) {
        // The exponent is very big. Saturate rather than overflow the exponent.
        // signed integer, which would be undefined behaviour.
        written_exponent = written_exponent_overflow;
      } else {
        written_exponent = static_cast<int_type>(
            static_cast<int_type>(written_exponent * 10) + digit);
      }
    } else {
      break;
    }
    is.get();
    next_char = is.peek();
  }
  if (!seen_written_exponent_digits) {
    // Binary exponent had no digits.
    is.setstate(std::ios::failbit);
    return is;
  }

  written_exponent = static_cast<int_type>(written_exponent * exponent_sign);
  // Now fold in the exponent bias into the written exponent, updating exponent.
  // But avoid undefined behaviour that would result from overflowing int_type.
  if (written_exponent >= 0 && exponent >= 0) {
    // Saturate up to written_exponent_overflow.
    if (written_exponent_overflow - exponent > written_exponent) {
      exponent = static_cast<int_type>(written_exponent + exponent);
    } else {
      exponent = written_exponent_overflow;
    }
  } else if (written_exponent < 0 && exponent < 0) {
    // Saturate down to -written_exponent_overflow.
    if (written_exponent_overflow + exponent > -written_exponent) {
      exponent = static_cast<int_type>(written_exponent + exponent);
    } else {
      exponent = static_cast<int_type>(-written_exponent_overflow);
    }
  } else {
    // They're of opposing sign, so it's safe to add.
    exponent = static_cast<int_type>(written_exponent + exponent);
  }

  bool is_zero = (!has_integer_part) && (fraction == 0);
  if ((!has_integer_part) && !is_zero) {
    fraction = static_cast<uint_type>(fraction << 1);
    exponent = static_cast<int_type>(exponent - 1);
  } else if (is_zero) {
    exponent = 0;
  }

  if (exponent <= 0 && !is_zero) {
    fraction = static_cast<uint_type>(fraction >> 1);
    fraction |= static_cast<uint_type>(1) << HF::top_bit_left_shift;
  }

  fraction = (fraction >> HF::fraction_right_shift) & HF::fraction_encode_mask;

  const int_type max_exponent =
      SetBits<uint_type, 0, HF::num_exponent_bits>::get;

  // Handle denorm numbers
  while (exponent < 0 && !is_zero) {
    fraction = static_cast<uint_type>(fraction >> 1);
    exponent = static_cast<int_type>(exponent + 1);

    fraction &= HF::fraction_encode_mask;
    if (fraction == 0) {
      // We have underflowed our fraction. We should clamp to zero.
      is_zero = true;
      exponent = 0;
    }
  }

  // We have overflowed so we should be inf/-inf.
  if (exponent > max_exponent) {
    exponent = max_exponent;
    fraction = 0;
  }

  uint_type output_bits = static_cast<uint_type>(
      static_cast<uint_type>(negate_value ? 1 : 0) << HF::top_bit_left_shift);
  output_bits |= fraction;

  uint_type shifted_exponent = static_cast<uint_type>(
      static_cast<uint_type>(exponent << HF::exponent_left_shift) &
      HF::exponent_mask);
  output_bits |= shifted_exponent;

  T output_float(output_bits);
  value.set_value(output_float);

  return is;
}